

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.hpp
# Opt level: O0

MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
* lambda::streams::Pipeable::
  pipeable<lambda::streams::Range<std::vector<int,std::allocator<int>>>,lambda::streams::Map<lambda::Curried<std::plus<void>,int>>>
            (Range<std::vector<int,_std::allocator<int>_>_> *arg,
            Map<lambda::Curried<std::plus<void>,_int>_> *pipeable)

{
  Range<std::vector<int,_std::allocator<int>_>_> *in_RSI;
  MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
  *in_RDI;
  Range<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff88;
  MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
  *this;
  
  this = in_RDI;
  Range<std::vector<int,_std::allocator<int>_>_>::Range
            ((Range<std::vector<int,_std::allocator<int>_>_> *)in_RDI,in_stack_ffffffffffffff88);
  Map<lambda::Curried<std::plus<void>,int>>::
  pipe<lambda::streams::Range<std::vector<int,std::allocator<int>>>>
            ((Map<lambda::Curried<std::plus<void>,_int>_> *)this,in_RSI);
  Range<std::vector<int,_std::allocator<int>_>_>::~Range
            ((Range<std::vector<int,_std::allocator<int>_>_> *)0x18cf79);
  return in_RDI;
}

Assistant:

static auto pipeable(Arg &&arg, Pipeable pipeable) {
        return pipeable.pipe(std::forward<Arg>(arg));
    }